

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

bool wasm::DataFlow::allInputsIdentical(Node *node)

{
  Id IVar1;
  Node *this;
  bool bVar2;
  bool bVar3;
  pointer ppNVar4;
  long lVar5;
  pointer ppNVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (node->type == Phi) {
    ppNVar4 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppNVar6 = (node->values).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (long)ppNVar6 - (long)ppNVar4 >> 3;
    if (uVar7 < 2) {
      uVar8 = 1;
    }
    else {
      if ((ulong)((long)ppNVar6 - (long)ppNVar4) < 0x11) {
        return true;
      }
      this = ppNVar4[1];
      uVar8 = 2;
      uVar9 = 3;
      while (uVar7 = (long)ppNVar6 - (long)ppNVar4 >> 3, uVar8 < uVar7) {
        bVar3 = Node::operator==(this,ppNVar4[uVar8]);
        if (!bVar3) {
          return bVar3;
        }
        ppNVar4 = (node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppNVar6 = (node->values).
                  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar2 = (ulong)((long)ppNVar6 - (long)ppNVar4 >> 3) <= uVar9;
        uVar8 = uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
        if (bVar2) {
          return bVar3;
        }
      }
    }
  }
  else {
    if (node->type != Expr) {
      return false;
    }
    IVar1 = ((node->field_1).expr)->_id;
    if (IVar1 == SelectId) {
      ppNVar4 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(node->values).
                    super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar4;
      uVar7 = lVar5 >> 3;
      if (1 < uVar7) {
        if (lVar5 != 0x10) {
          ppNVar6 = ppNVar4 + 1;
          ppNVar4 = ppNVar4 + 2;
          goto LAB_0082b3b4;
        }
        uVar8 = 2;
        goto LAB_0082b3d0;
      }
    }
    else {
      if (IVar1 != BinaryId) {
        return false;
      }
      ppNVar6 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppNVar4 = (node->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      uVar7 = (long)ppNVar4 - (long)ppNVar6 >> 3;
      if (ppNVar4 == ppNVar6) {
        uVar8 = 0;
        goto LAB_0082b3d0;
      }
      if (1 < uVar7) {
        ppNVar4 = ppNVar6 + 1;
LAB_0082b3b4:
        bVar3 = Node::operator==(*ppNVar6,*ppNVar4);
        return bVar3;
      }
    }
    uVar8 = 1;
  }
LAB_0082b3d0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8,uVar7
            );
}

Assistant:

inline bool allInputsIdentical(Node* node) {
  switch (node->type) {
    case Node::Type::Expr: {
      if (node->expr->is<Binary>()) {
        return *(node->getValue(0)) == *(node->getValue(1));
      } else if (node->expr->is<Select>()) {
        return *(node->getValue(1)) == *(node->getValue(2));
      }
      break;
    }
    case Node::Type::Phi: {
      auto* first = node->getValue(1);
      // Check if any of the others are not equal
      for (Index i = 2; i < node->values.size(); i++) {
        auto* curr = node->getValue(i);
        if (*first != *curr) {
          return false;
        }
      }
      return true;
    }
    default: {}
  }
  return false;
}